

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_insert_int(void *id,int idx,int elem)

{
  uint uVar1;
  array *paVar2;
  void *pvVar3;
  undefined4 in_EDX;
  int in_ESI;
  void *in_RDI;
  int *ptr;
  int n;
  int i;
  int in_stack_ffffffffffffffec;
  
  paVar2 = id_to_array(in_RDI);
  uVar1 = *(uint *)&paVar2->field_0x4 >> 4;
  pvVar3 = prf_array_append_int((void *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  if (in_ESI < (int)uVar1) {
    for (; in_ESI < (int)uVar1; uVar1 = uVar1 - 1) {
      *(undefined4 *)((long)pvVar3 + (long)(int)uVar1 * 4) =
           *(undefined4 *)((long)pvVar3 + (long)(int)(uVar1 - 1) * 4);
    }
    *(undefined4 *)((long)pvVar3 + (long)in_ESI * 4) = in_EDX;
  }
  return pvVar3;
}

Assistant:

void *
prf_array_insert_int(void *id, int idx, int elem)
{
  int i, n;
  int *ptr;

  n = id_to_array(id)->numelem;

  /* make room for one more */
  ptr = (int*)prf_array_append_int(id, elem);

  if (idx < n) {
    for (i = n; i > idx; i--) {
      ptr[i] = ptr[i-1]; 
    }
    ptr[idx] = elem;
  }
  return ptr;
}